

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O3

void __thiscall
iu_Matcher_x_iutest_x_StrCaseEq_Test::Body(iu_Matcher_x_iutest_x_StrCaseEq_Test *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  AssertionResult *in_R8;
  AssertionResult iutest_ar_2;
  AssertionResult iutest_ar;
  string local_3c8;
  AssertionResult local_3a8;
  undefined1 local_380 [32];
  char *local_360;
  undefined8 local_358;
  detail *local_350 [2];
  long local_340 [2];
  undefined1 local_330 [16];
  undefined1 local_320 [376];
  undefined1 local_1a8 [32];
  char *local_188;
  undefined8 local_180;
  ios_base local_128 [264];
  
  local_330._0_8_ = &PTR__IMatcher_0023d918;
  local_330._8_8_ = "Hoge";
  iutest::detail::StrCaseEqMatcher<char[5]>::operator()
            ((AssertionResult *)local_380,(StrCaseEqMatcher<char[5]> *)local_330,
             (char (*) [5])0x206582);
  if (local_360._0_1_ == false) {
    memset((iu_global_format_stringstream *)local_330,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_330);
    iutest::PrintToString<char[5]>(&local_3c8,(char (*) [5])0x206582);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3a8.m_message,(detail *)local_3c8._M_dataplus._M_p,"StrCaseEq(\"Hoge\")",
               local_380,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,local_3a8.m_message._M_dataplus._M_p,(allocator<char> *)local_350
              );
    local_188 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_180 = 0x1000000e9;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1a8,(Fixed *)local_330,false);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_message._M_dataplus._M_p != &local_3a8.m_message.field_2) {
      operator_delete(local_3a8.m_message._M_dataplus._M_p,
                      local_3a8.m_message.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_330);
    std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  }
  pcVar1 = local_380 + 0x10;
  if ((pointer)local_380._0_8_ != pcVar1) {
    operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
  }
  local_330._0_8_ = &PTR__IMatcher_0023d958;
  local_330._8_8_ = (anonymous_namespace)::hoge_abi_cxx11_;
  iutest::detail::StrCaseEqMatcher<std::__cxx11::string>::operator()
            ((AssertionResult *)local_380,(StrCaseEqMatcher<std::__cxx11::string> *)local_330,
             (char (*) [5])0x206592);
  if (local_360._0_1_ == false) {
    memset((iu_global_format_stringstream *)local_330,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_330);
    iutest::PrintToString<char[5]>(&local_3c8,(char (*) [5])0x206592);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3a8.m_message,(detail *)local_3c8._M_dataplus._M_p,"StrCaseEq(hoge)",local_380
               ,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,local_3a8.m_message._M_dataplus._M_p,(allocator<char> *)local_350
              );
    local_188 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_180 = 0x1000000ea;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1a8,(Fixed *)local_330,false);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_message._M_dataplus._M_p != &local_3a8.m_message.field_2) {
      operator_delete(local_3a8.m_message._M_dataplus._M_p,
                      local_3a8.m_message.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_330);
    std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  }
  if ((pointer)local_380._0_8_ != pcVar1) {
    operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
  }
  local_330._0_8_ = &PTR__IMatcher_0023d918;
  local_330._8_8_ = "hOge";
  iutest::detail::StrCaseEqMatcher<char[5]>::operator()
            (&local_3a8,(StrCaseEqMatcher<char[5]> *)local_330,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (anonymous_namespace)::hoge_abi_cxx11_);
  if (local_3a8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_330);
    iutest::detail::
    iuUniversalPrinter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Print((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (anonymous_namespace)::hoge_abi_cxx11_,(iu_ostream *)local_320);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_330);
    std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3c8,local_350[0],"StrCaseEq(\"hOge\")",(char *)&local_3a8,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_380,local_3c8._M_dataplus._M_p,(allocator<char> *)local_330);
    local_360 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_358._0_4_ = 0xeb;
    local_358._4_4_ = 1;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_380,(Fixed *)local_1a8,false);
    if ((pointer)local_380._0_8_ != pcVar1) {
      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if (local_350[0] != (detail *)local_340) {
      operator_delete(local_350[0],local_340[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  paVar2 = &local_3a8.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_3a8.m_message._M_dataplus._M_p,
                    local_3a8.m_message.field_2._M_allocated_capacity + 1);
  }
  local_330._0_8_ = &PTR__IMatcher_0023d958;
  local_330._8_8_ = (anonymous_namespace)::Hoge_abi_cxx11_;
  iutest::detail::StrCaseEqMatcher<std::__cxx11::string>::operator()
            (&local_3a8,(StrCaseEqMatcher<std::__cxx11::string> *)local_330,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (anonymous_namespace)::hoge_abi_cxx11_);
  if (local_3a8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_330);
    iutest::detail::
    iuUniversalPrinter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Print((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (anonymous_namespace)::hoge_abi_cxx11_,(iu_ostream *)local_320);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_330);
    std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3c8,local_350[0],"StrCaseEq(Hoge)",(char *)&local_3a8,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_380,local_3c8._M_dataplus._M_p,(allocator<char> *)local_330);
    local_360 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_358._0_4_ = 0xec;
    local_358._4_4_ = 1;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_380,(Fixed *)local_1a8,false);
    if ((pointer)local_380._0_8_ != pcVar1) {
      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if (local_350[0] != (detail *)local_340) {
      operator_delete(local_350[0],local_340[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_3a8.m_message._M_dataplus._M_p,
                    local_3a8.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(Matcher, FloatNear)
{
    IUTEST_EXPECT_THAT(f0, FloatNear(0.0f, 0.0f));
    IUTEST_EXPECT_THAT(f0, FloatNear(1.0f, 1.0f));
    IUTEST_EXPECT_THAT(f0, FloatingPointNear(0.0f, 0.0f));
}